

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualOutput.cpp
# Opt level: O2

void __thiscall visualOutput::takeValue(visualOutput *this)

{
  outputArrow *poVar1;
  WINDOW *pWVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  int val;
  
  poVar1 = (this->super_output).outArr;
  iVar3 = (*(poVar1->super_arrowType)._vptr_arrowType[2])(poVar1,0xfffffffffffffffe);
  val = (int)(short)iVar3;
  std::vector<int,_std::allocator<int>_>::push_back(&this->in,&val);
  if (val == -1) {
    piVar4 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = piVar4;
    if ((this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != piVar4) {
      (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar4;
    }
  }
  else {
    piVar4 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar7 = (long)piVar6 - (long)piVar4 >> 2;
  if ((2 < uVar7) && (((long)*piVar4 + uVar7) - 3 < (ulong)(long)this->width)) {
    flash();
    pWVar2 = this->visualWin;
    if (pWVar2 == (WINDOW *)0x0) {
      iVar3 = -1;
      iVar8 = -1;
    }
    else {
      iVar8 = (int)pWVar2->_begy;
      iVar3 = (int)pWVar2->_begx;
    }
    piVar4 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar9 = newwin(1,1,piVar4[1] + iVar8,
                    (int)((ulong)((long)(this->in).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar4) >>
                         2) + *piVar4 + iVar3 + -3);
    this->highlight = auVar9._0_8_;
    iVar5 = val * 0x100 + 0x600;
    wbkgd(auVar9._0_8_,(short)iVar5,auVar9._8_8_,iVar5);
    mvwprintw(this->highlight,iVar8,
              (int)((ulong)((long)(this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2) + iVar3 + -3," ");
    wrefresh(this->highlight);
    delwin(this->highlight);
  }
  return;
}

Assistant:

void visualOutput::takeValue() {
	int val = outArr->nodeGet(OUTPUT_ID);
	in.push_back(val);

	if (val == -1)
		in.clear();

	if (in.size() > 2 && in[0] + in.size() - 3 < width) {
		flash();
		int y,x;
		getbegyx(visualWin, y, x);
		highlight = newwin(1, 1, in[1] + y, in[0] + in.size() - 3 + x);
		wbkgd(highlight, COLOR_PAIR(val + 6));
		mvwprintw(highlight, y, x + in.size() - 3, " ");
		wrefresh(highlight);
		delwin(highlight);
	}

	return;
}